

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O2

void anon_unknown.dwarf_50b73::InitVoice
               (Voice *voice,ALsource *source,BufferlistItem *BufferList,ALCcontext *context,
               ALCdevice *device)

{
  vector<ChannelData> *this;
  ALuint in_order;
  uint uVar1;
  BufferStorage *this_00;
  pointer pCVar2;
  pointer pCVar3;
  uint uVar4;
  uint uVar5;
  BufferlistItem *pBVar6;
  EVP_PKEY_CTX *pEVar7;
  ChannelData *chandata_2;
  pointer pCVar8;
  array<unsigned_char,_7UL> *paVar9;
  size_type __n;
  EVP_PKEY_CTX *ctx;
  ChannelData *chandata;
  ChannelData *chandata_1;
  array<float,_4UL> scales;
  BandSplitter splitter;
  _Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_> local_e8;
  undefined4 uStack_d0;
  undefined8 local_cc;
  undefined4 local_c4;
  undefined1 local_c0 [144];
  
  if (source->Looping == true) {
    pBVar6 = source->queue;
  }
  else {
    pBVar6 = (BufferlistItem *)0x0;
  }
  (voice->mLoopBuffer)._M_b._M_p = pBVar6;
  this_00 = BufferList->mBuffer;
  uVar4 = BufferStorage::channelsFromFmt(this_00);
  voice->mFrequency = this_00->mSampleRate;
  voice->mFmtChannels = this_00->mChannels;
  uVar5 = BufferStorage::bytesFromFmt(this_00);
  voice->mSampleSize = uVar5;
  voice->mAmbiLayout = this_00->mAmbiLayout;
  voice->mAmbiScaling = this_00->mAmbiScaling;
  voice->mAmbiOrder = this_00->mAmbiOrder;
  if (this_00->mCallback == (CallbackType)0x0) {
    if (source->SourceType == 0x1028) {
      uVar1 = 1;
      goto LAB_00125449;
    }
  }
  else {
    uVar1 = 2;
LAB_00125449:
    voice->mFlags = voice->mFlags | uVar1;
  }
  voice->mNumCallbackSamples = 0;
  voice->mStep = 0;
  this = &voice->mChans;
  pCVar8 = (voice->mChans).
           super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar2 = (voice->mChans).
           super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pEVar7 = (EVP_PKEY_CTX *)(((long)pCVar2 - (long)pCVar8) / 4000);
  ctx = (EVP_PKEY_CTX *)(ulong)uVar4;
  if (ctx < pEVar7 && (EVP_PKEY_CTX *)0x2 < pEVar7) {
    pCVar3 = (voice->mChans).
             super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_e8._M_impl.super__Vector_impl_data._M_finish._0_4_ = SUB84(pCVar3,0);
    local_e8._M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)pCVar3 >> 0x20);
    local_e8._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(pCVar2,0);
    local_e8._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         (undefined4)((ulong)pCVar2 >> 0x20);
    (this->super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>)._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    (voice->mChans).super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (voice->mChans).super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8._M_impl.super__Vector_impl_data._M_start = pCVar8;
    std::_Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>::~_Vector_base
              (&local_e8);
  }
  __n = 2;
  if (2 < uVar4) {
    __n = (size_type)uVar4;
  }
  std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>::reserve(this,__n);
  std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>::resize
            (this,(size_type)ctx);
  in_order = voice->mAmbiOrder;
  if (in_order != 0) {
    uVar1 = device->mAmbiOrder;
    ctx = (EVP_PKEY_CTX *)(ulong)uVar1;
    if (in_order < uVar1) {
      if (voice->mFmtChannels == FmtBFormat2D) {
        paVar9 = &AmbiIndex::OrderFrom2DChannel;
      }
      else {
        paVar9 = (array<unsigned_char,_7UL> *)&AmbiIndex::OrderFromChannel;
      }
      scales = BFormatDec::GetHFOrderScales(in_order,uVar1);
      BandSplitterR<float>::BandSplitterR(&splitter,400.0 / (float)device->Frequency);
      pCVar2 = (voice->mChans).
               super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pCVar8 = (voice->mChans).
                    super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>
                    ._M_impl.super__Vector_impl_data._M_start; pCVar8 != pCVar2; pCVar8 = pCVar8 + 1
          ) {
        local_e8._M_impl.super__Vector_impl_data._M_start =
             (pointer)((ulong)local_e8._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000
                      );
        std::array<float,_48UL>::fill(&pCVar8->mPrevSamples,(value_type_conflict *)&local_e8);
        pCVar8->mAmbiScale = scales._M_elems[paVar9->_M_elems[0]];
        (pCVar8->mAmbiSplitter).mCoeff = splitter.mCoeff;
        (pCVar8->mAmbiSplitter).mLpZ1 = splitter.mLpZ1;
        (pCVar8->mAmbiSplitter).mLpZ2 = splitter.mLpZ2;
        (pCVar8->mAmbiSplitter).mApZ1 = splitter.mApZ1;
        (pCVar8->mDryParams).LowPass.mZ1 = 0.0;
        (pCVar8->mDryParams).LowPass.mZ2 = 0.0;
        (pCVar8->mDryParams).LowPass.mB0 = 1.0;
        (pCVar8->mDryParams).HighPass.mZ1 = 0.0;
        (pCVar8->mDryParams).HighPass.mZ2 = 0.0;
        paVar9 = (array<unsigned_char,_7UL> *)((long)paVar9 + 1);
        (pCVar8->mDryParams).LowPass.mB1 = 0.0;
        (pCVar8->mDryParams).LowPass.mB2 = 0.0;
        (pCVar8->mDryParams).LowPass.mA1 = 0.0;
        (pCVar8->mDryParams).LowPass.mA2 = 0.0;
        (pCVar8->mDryParams).HighPass.mB0 = 1.0;
        memset(&(pCVar8->mDryParams).HighPass.mB1,0,0xa48);
        uVar1 = device->NumAuxSends;
        local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_e8._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x3f800000;
        local_e8._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
        local_e8._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        local_e8._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        uStack_d0 = 0;
        local_cc = 0;
        local_c4 = 0x3f800000;
        memset(local_c0,0,0x90);
        ctx = (EVP_PKEY_CTX *)(ulong)uVar1;
        std::__fill_n_a<SendParams*,unsigned_int,SendParams>(&pCVar8->mWetParams,ctx,&local_e8);
      }
      *(byte *)&voice->mFlags = (byte)voice->mFlags | 4;
      goto LAB_00125722;
    }
  }
  pCVar2 = (voice->mChans).
           super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar8 = (voice->mChans).
                super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>.
                _M_impl.super__Vector_impl_data._M_start; pCVar8 != pCVar2; pCVar8 = pCVar8 + 1) {
    local_e8._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_e8._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    std::array<float,_48UL>::fill(&pCVar8->mPrevSamples,(value_type_conflict *)&local_e8);
    (pCVar8->mDryParams).LowPass.mZ1 = 0.0;
    (pCVar8->mDryParams).LowPass.mZ2 = 0.0;
    (pCVar8->mDryParams).LowPass.mB0 = 1.0;
    (pCVar8->mDryParams).HighPass.mZ1 = 0.0;
    (pCVar8->mDryParams).HighPass.mZ2 = 0.0;
    (pCVar8->mDryParams).LowPass.mB1 = 0.0;
    (pCVar8->mDryParams).LowPass.mB2 = 0.0;
    (pCVar8->mDryParams).LowPass.mA1 = 0.0;
    (pCVar8->mDryParams).LowPass.mA2 = 0.0;
    (pCVar8->mDryParams).HighPass.mB0 = 1.0;
    memset(&(pCVar8->mDryParams).HighPass.mB1,0,0xa48);
    uVar1 = device->NumAuxSends;
    local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x3f800000;
    local_e8._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    local_e8._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    local_e8._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    uStack_d0 = 0;
    local_cc = 0;
    local_c4 = 0x3f800000;
    memset(local_c0,0,0x90);
    ctx = (EVP_PKEY_CTX *)(ulong)uVar1;
    std::__fill_n_a<SendParams*,unsigned_int,SendParams>(&pCVar8->mWetParams,ctx,&local_e8);
  }
LAB_00125722:
  if (0.0 < device->AvgSpeakerDist) {
    pCVar2 = (voice->mChans).
             super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pCVar8 = (voice->mChans).
                  super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>.
                  _M_impl.super__Vector_impl_data._M_start; pCVar8 != pCVar2; pCVar8 = pCVar8 + 1) {
      NfcFilter::init(&(pCVar8->mDryParams).NFCtrlFilter,ctx);
    }
  }
  LOCK();
  (source->PropsClean).super___atomic_flag_base._M_i = true;
  UNLOCK();
  UpdateSourceProps(source,voice,context);
  (voice->mSourceID).super___atomic_base<unsigned_int>._M_i = source->id;
  return;
}

Assistant:

void InitVoice(Voice *voice, ALsource *source, BufferlistItem *BufferList, ALCcontext *context,
    ALCdevice *device)
{
    voice->mLoopBuffer.store(source->Looping ? source->queue : nullptr, std::memory_order_relaxed);

    BufferStorage *buffer{BufferList->mBuffer};
    ALuint num_channels{buffer->channelsFromFmt()};
    voice->mFrequency = buffer->mSampleRate;
    voice->mFmtChannels = buffer->mChannels;
    voice->mSampleSize  = buffer->bytesFromFmt();
    voice->mAmbiLayout = buffer->mAmbiLayout;
    voice->mAmbiScaling = buffer->mAmbiScaling;
    voice->mAmbiOrder = buffer->mAmbiOrder;

    if(buffer->mCallback) voice->mFlags |= VoiceIsCallback;
    else if(source->SourceType == AL_STATIC) voice->mFlags |= VoiceIsStatic;
    voice->mNumCallbackSamples = 0;

    /* Clear the stepping value explicitly so the mixer knows not to mix this
     * until the update gets applied.
     */
    voice->mStep = 0;

    if(voice->mChans.capacity() > 2 && num_channels < voice->mChans.capacity())
        al::vector<Voice::ChannelData>{}.swap(voice->mChans);
    voice->mChans.reserve(maxu(2, num_channels));
    voice->mChans.resize(num_channels);

    /* Don't need to set the VOICE_IS_AMBISONIC flag if the device is not
     * higher order than the voice. No HF scaling is necessary to mix it.
     */
    if(voice->mAmbiOrder && device->mAmbiOrder > voice->mAmbiOrder)
    {
        const uint8_t *OrderFromChan{(voice->mFmtChannels == FmtBFormat2D) ?
            AmbiIndex::OrderFrom2DChannel.data() :
            AmbiIndex::OrderFromChannel.data()};
        const auto scales = BFormatDec::GetHFOrderScales(voice->mAmbiOrder, device->mAmbiOrder);

        const BandSplitter splitter{400.0f / static_cast<float>(device->Frequency)};

        for(auto &chandata : voice->mChans)
        {
            chandata.mPrevSamples.fill(0.0f);
            chandata.mAmbiScale = scales[*(OrderFromChan++)];
            chandata.mAmbiSplitter = splitter;
            chandata.mDryParams = DirectParams{};
            std::fill_n(chandata.mWetParams.begin(), device->NumAuxSends, SendParams{});
        }

        voice->mFlags |= VoiceIsAmbisonic;
    }
    else
    {
        /* Clear previous samples. */
        for(auto &chandata : voice->mChans)
        {
            chandata.mPrevSamples.fill(0.0f);
            chandata.mDryParams = DirectParams{};
            std::fill_n(chandata.mWetParams.begin(), device->NumAuxSends, SendParams{});
        }
    }

    if(device->AvgSpeakerDist > 0.0f)
    {
        const float w1{SpeedOfSoundMetersPerSec /
            (device->AvgSpeakerDist * static_cast<float>(device->Frequency))};
        for(auto &chandata : voice->mChans)
            chandata.mDryParams.NFCtrlFilter.init(w1);
    }

    source->PropsClean.test_and_set(std::memory_order_acq_rel);
    UpdateSourceProps(source, voice, context);

    voice->mSourceID.store(source->id, std::memory_order_release);
}